

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O3

int __thiscall FShaderManager::Find(FShaderManager *this,char *shn)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = FName::NameManager::FindName(&FName::NameData,shn,false);
  uVar2 = (ulong)(this->mTextureEffects).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if (((this->mTextureEffects).Array[uVar3]->mName).Index == iVar1) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return -1;
}

Assistant:

int FShaderManager::Find(const char * shn)
{
	FName sfn = shn;

	for(unsigned int i=0;i<mTextureEffects.Size();i++)
	{
		if (mTextureEffects[i]->mName == sfn)
		{
			return i;
		}
	}
	return -1;
}